

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::UnitTest::AddTestPartResult
          (UnitTest *this,Type result_type,char *file_name,int line_number,String *message,
          String *os_stack_trace)

{
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *pvVar1;
  size_type sVar2;
  char *pcVar3;
  TestPartResult *this_00;
  undefined8 uVar4;
  undefined4 in_ECX;
  int in_ESI;
  undefined8 in_RDI;
  String *in_R9;
  TestPartResult result;
  TraceInfo *trace;
  int i;
  MutexLock lock;
  Message msg;
  MutexBase *in_stack_fffffffffffffe98;
  String *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffec0;
  TestPartResult *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  Type a_type;
  TestPartResult *in_stack_fffffffffffffee0;
  String local_d0;
  undefined1 local_c0 [64];
  string local_80 [32];
  reference local_60;
  int local_54;
  char local_38 [8];
  String *local_30;
  undefined4 local_1c;
  int local_c;
  
  pcVar3 = local_38;
  local_30 = in_R9;
  local_1c = in_ECX;
  local_c = in_ESI;
  Message::Message((Message *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  Message::operator<<((Message *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      (String *)in_stack_fffffffffffffea8);
  internal::GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  pvVar1 = internal::UnitTestImpl::gtest_trace_stack((UnitTestImpl *)0x23dd4d);
  sVar2 = std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::
          size(pvVar1);
  if (sVar2 != 0) {
    Message::operator<<((Message *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (char (*) [2])in_stack_fffffffffffffea8);
    Message::operator<<((Message *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (char (*) [12])in_stack_fffffffffffffea8);
    Message::operator<<((Message *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (char (*) [8])in_stack_fffffffffffffea8);
    pvVar1 = internal::UnitTestImpl::gtest_trace_stack((UnitTestImpl *)0x23ddc5);
    sVar2 = std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
            ::size(pvVar1);
    for (local_54 = (int)sVar2; 0 < local_54; local_54 = local_54 + -1) {
      pvVar1 = internal::UnitTestImpl::gtest_trace_stack((UnitTestImpl *)0x23ddfc);
      local_60 = std::
                 vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
                 ::operator[](pvVar1,(long)(local_54 + -1));
      Message::operator<<((Message *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          (char (*) [2])in_stack_fffffffffffffea8);
      internal::FormatFileLocation_abi_cxx11_(pcVar3,(int)((ulong)in_RDI >> 0x20));
      Message::operator<<((Message *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffea8);
      in_stack_fffffffffffffee0 =
           (TestPartResult *)
           Message::operator<<((Message *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                               (char (*) [2])in_stack_fffffffffffffea8);
      Message::operator<<((Message *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          (String *)in_stack_fffffffffffffea8);
      std::__cxx11::string::~string(local_80);
    }
  }
  pcVar3 = internal::String::c_str(local_30);
  if ((pcVar3 != (char *)0x0) &&
     (in_stack_fffffffffffffed7 = internal::String::empty(in_stack_fffffffffffffea0),
     !(bool)in_stack_fffffffffffffed7)) {
    in_stack_fffffffffffffec8 =
         (TestPartResult *)
         Message::operator<<((Message *)
                             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                             (char (*) [15])in_stack_fffffffffffffea8);
    Message::operator<<((Message *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                        (String *)in_stack_fffffffffffffea8);
  }
  a_type = (Type)((ulong)pcVar3 >> 0x20);
  Message::GetString((Message *)in_stack_fffffffffffffea8);
  internal::String::c_str(&local_d0);
  TestPartResult::TestPartResult
            (in_stack_fffffffffffffee0,a_type,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             (char *)CONCAT44(local_1c,in_stack_fffffffffffffec0));
  internal::String::~String(in_stack_fffffffffffffea0);
  this_00 = (TestPartResult *)
            internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread
                      ((UnitTestImpl *)0x23e019);
  (*(*(_func_int ***)this_00)[2])(this_00,local_c0);
  if (local_c != 0) {
    if ((FLAGS_gtest_break_on_failure & 1) == 0) {
      if ((FLAGS_gtest_throw_on_failure & 1) != 0) {
        uVar4 = __cxa_allocate_exception(0x10);
        GoogleTestFailureException::GoogleTestFailureException
                  ((GoogleTestFailureException *)
                   CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8);
        __cxa_throw(uVar4,&GoogleTestFailureException::typeinfo,
                    GoogleTestFailureException::~GoogleTestFailureException);
      }
    }
    else {
      uRam0000000000000000 = 1;
    }
  }
  TestPartResult::~TestPartResult(this_00);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x23e120);
  Message::~Message((Message *)0x23e12d);
  return;
}

Assistant:

void UnitTest::AddTestPartResult(TestPartResult::Type result_type,
                                 const char* file_name,
                                 int line_number,
                                 const internal::String& message,
                                 const internal::String& os_stack_trace) {
  Message msg;
  msg << message;

  internal::MutexLock lock(&mutex_);
  if (impl_->gtest_trace_stack().size() > 0) {
    msg << "\n" << GTEST_NAME_ << " trace:";

    for (int i = static_cast<int>(impl_->gtest_trace_stack().size());
         i > 0; --i) {
      const internal::TraceInfo& trace = impl_->gtest_trace_stack()[i - 1];
      msg << "\n" << internal::FormatFileLocation(trace.file, trace.line)
          << " " << trace.message;
    }
  }

  if (os_stack_trace.c_str() != NULL && !os_stack_trace.empty()) {
    msg << internal::kStackTraceMarker << os_stack_trace;
  }

  const TestPartResult result =
    TestPartResult(result_type, file_name, line_number,
                   msg.GetString().c_str());
  impl_->GetTestPartResultReporterForCurrentThread()->
      ReportTestPartResult(result);

  if (result_type != TestPartResult::kSuccess) {
    // gtest_break_on_failure takes precedence over
    // gtest_throw_on_failure.  This allows a user to set the latter
    // in the code (perhaps in order to use Google Test assertions
    // with another testing framework) and specify the former on the
    // command line for debugging.
    if (GTEST_FLAG(break_on_failure)) {
#if GTEST_OS_WINDOWS
      // Using DebugBreak on Windows allows gtest to still break into a debugger
      // when a failure happens and both the --gtest_break_on_failure and
      // the --gtest_catch_exceptions flags are specified.
      DebugBreak();
#else
      // Dereference NULL through a volatile pointer to prevent the compiler
      // from removing. We use this rather than abort() or __builtin_trap() for
      // portability: Symbian doesn't implement abort() well, and some debuggers
      // don't correctly trap abort().
      *static_cast<volatile int*>(NULL) = 1;
#endif  // GTEST_OS_WINDOWS
    } else if (GTEST_FLAG(throw_on_failure)) {
#if GTEST_HAS_EXCEPTIONS
      throw GoogleTestFailureException(result);
#else
      // We cannot call abort() as it generates a pop-up in debug mode
      // that cannot be suppressed in VC 7.1 or below.
      exit(1);
#endif
    }
  }
}